

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticEmitterBeam.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,UnderwaterAcousticEmitterBeam *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"Underwater Acoustic Emitter Beam:",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,"\n\tBeam Data Length:              ",0x21);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"\n\tBeam ID Number:\t\t          ",0x1d);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  UnderwaterAcousticFundamentalParameterData::GetAsString_abi_cxx11_(&local_1c0,&this->m_UAFPD);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString UnderwaterAcousticEmitterBeam::GetAsString() const
{
    KStringStream ss;

    ss << "Underwater Acoustic Emitter Beam:"
       << "\n\tBeam Data Length:              " << ( KUINT16 )m_ui8BeamDataLength
       << "\n\tBeam ID Number:		          " << ( KUINT16 )m_ui8BeamIDNumber
       << m_UAFPD.GetAsString();

    return ss.str();
}